

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationWeights::incWeightByOffset
          (CollationWeights *this,uint32_t weight,int32_t length,int32_t offset)

{
  uint32_t uVar1;
  uint byte;
  int iVar2;
  int32_t iVar3;
  int local_1c;
  int local_18;
  int32_t offset_local;
  int32_t length_local;
  uint32_t weight_local;
  CollationWeights *this_local;
  
  local_1c = offset;
  local_18 = length;
  offset_local = weight;
  while( true ) {
    uVar1 = getWeightByte(offset_local,local_18);
    byte = uVar1 + local_1c;
    if (byte <= this->maxBytes[local_18]) break;
    iVar2 = byte - this->minBytes[local_18];
    uVar1 = this->minBytes[local_18];
    iVar3 = countBytes(this,local_18);
    offset_local = setWeightByte(offset_local,local_18,uVar1 + iVar2 % iVar3);
    local_1c = countBytes(this,local_18);
    local_1c = iVar2 / local_1c;
    local_18 = local_18 + -1;
  }
  uVar1 = setWeightByte(offset_local,local_18,byte);
  return uVar1;
}

Assistant:

uint32_t
CollationWeights::incWeightByOffset(uint32_t weight, int32_t length, int32_t offset) const {
    for(;;) {
        offset += getWeightByte(weight, length);
        if((uint32_t)offset <= maxBytes[length]) {
            return setWeightByte(weight, length, offset);
        } else {
            // Split the offset between this byte and the previous one.
            offset -= minBytes[length];
            weight = setWeightByte(weight, length, minBytes[length] + offset % countBytes(length));
            offset /= countBytes(length);
            --length;
            U_ASSERT(length > 0);
        }
    }
}